

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O2

void denseScale(realtype c,realtype **a,sunindextype m,sunindextype n)

{
  realtype *prVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 0;
  if (m < 1) {
    m = lVar2;
  }
  if (n < 1) {
    n = lVar2;
  }
  for (; lVar2 != n; lVar2 = lVar2 + 1) {
    prVar1 = a[lVar2];
    for (lVar3 = 0; m != lVar3; lVar3 = lVar3 + 1) {
      prVar1[lVar3] = prVar1[lVar3] * c;
    }
  }
  return;
}

Assistant:

void denseScale(realtype c, realtype **a, sunindextype m, sunindextype n)
{
  sunindextype i, j;
  realtype *col_j;

  for (j=0; j < n; j++) {
    col_j = a[j];
    for (i=0; i < m; i++)
      col_j[i] *= c;
  }
}